

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* testing::internal::anon_unknown_83::SplitEscapedString
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  value_type local_80;
  value_type local_60;
  size_t local_40;
  size_t i;
  ulong uStack_30;
  bool escaped;
  size_t end;
  size_t start;
  string *local_18;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  
  start._7_1_ = 0;
  local_18 = str;
  str_local = (string *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  end = 0;
  uStack_30 = std::__cxx11::string::size();
  if (((2 < uStack_30) &&
      (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar1 == '\"')) &&
     (pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18), *pcVar1 == '\"')) {
    end = end + 1;
    uStack_30 = uStack_30 - 1;
  }
  i._7_1_ = 0;
  for (local_40 = end; local_40 + 1 < uStack_30; local_40 = local_40 + 1) {
    if ((i._7_1_ & 1) == 0) {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      i._7_1_ = *pcVar1 == '\\';
    }
    else {
      i._7_1_ = 0;
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
      if (*pcVar1 == 'n') {
        std::__cxx11::string::substr((ulong)&local_60,(ulong)local_18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        end = local_40 + 1;
      }
    }
  }
  std::__cxx11::string::substr((ulong)&local_80,(ulong)local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> SplitEscapedString(const std::string& str) {
  std::vector<std::string> lines;
  size_t start = 0, end = str.size();
  if (end > 2 && str[0] == '"' && str[end - 1] == '"') {
    ++start;
    --end;
  }
  bool escaped = false;
  for (size_t i = start; i + 1 < end; ++i) {
    if (escaped) {
      escaped = false;
      if (str[i] == 'n') {
        lines.push_back(str.substr(start, i - start - 1));
        start = i + 1;
      }
    } else {
      escaped = str[i] == '\\';
    }
  }
  lines.push_back(str.substr(start, end - start));
  return lines;
}